

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall BuildWithLogTestRebuildAfterFailure::Run(BuildWithLogTestRebuildAfterFailure *this)

{
  State *state;
  VirtualFileSystem *this_00;
  Builder *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  int *piVar1;
  int iVar2;
  Test *pTVar3;
  bool bVar4;
  Node *pNVar5;
  string err;
  allocator<char> local_9a;
  allocator<char> local_99;
  string local_98;
  string local_78;
  string local_58;
  Plan *local_38;
  
  iVar2 = g_current_test->assertion_failures_;
  state = &(this->super_BuildWithLogTest).super_BuildTest.super_StateTestWithBuiltinRules.state_;
  AssertParse(state,
              "rule touch-fail-tick2\n  command = touch-fail-tick2\nbuild out1: touch-fail-tick2 in\n"
              ,(ManifestParserOptions)0x0);
  if (iVar2 == g_current_test->assertion_failures_) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"in",&local_99);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_9a);
    this_00 = &(this->super_BuildWithLogTest).super_BuildTest.fs_;
    VirtualFileSystem::Create(this_00,&local_98,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_98);
    pTVar3 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"out1",(allocator<char> *)&local_58);
    this_01 = &(this->super_BuildWithLogTest).super_BuildTest.builder_;
    pNVar5 = Builder::AddTarget(this_01,&local_98,&local_78);
    testing::Test::Check
              (pTVar3,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x51f,"builder_.AddTarget(\"out1\", &err)");
    std::__cxx11::string::~string((string *)&local_98);
    pTVar3 = g_current_test;
    bVar4 = Builder::Build(this_01,&local_78);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x520,"builder_.Build(&err)");
    pTVar3 = g_current_test;
    bVar4 = std::operator==("",&local_78);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x521,"\"\" == err");
    testing::Test::Check
              (g_current_test,
               (long)*(pointer *)
                      ((long)&(this->super_BuildWithLogTest).super_BuildTest.command_runner_.
                              commands_ran_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data + 8) -
               (long)(this->super_BuildWithLogTest).super_BuildTest.command_runner_.commands_ran_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start == 0x20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x522,"1u == command_runner_.commands_ran_.size()");
    this_02 = &(this->super_BuildWithLogTest).super_BuildTest.command_runner_.commands_ran_;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(this_02);
    State::Reset(state);
    Builder::Cleanup(this_01);
    local_38 = &(this->super_BuildWithLogTest).super_BuildTest.builder_.plan_;
    Plan::Reset(local_38);
    piVar1 = &(this->super_BuildWithLogTest).super_BuildTest.fs_.now_;
    *piVar1 = *piVar1 + 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"in",&local_99);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_9a);
    VirtualFileSystem::Create(this_00,&local_98,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_98);
    pTVar3 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"out1",(allocator<char> *)&local_58);
    pNVar5 = Builder::AddTarget(this_01,&local_98,&local_78);
    testing::Test::Check
              (pTVar3,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x52d,"builder_.AddTarget(\"out1\", &err)");
    std::__cxx11::string::~string((string *)&local_98);
    pTVar3 = g_current_test;
    bVar4 = Builder::Build(this_01,&local_78);
    testing::Test::Check
              (pTVar3,!bVar4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x52e,"builder_.Build(&err)");
    pTVar3 = g_current_test;
    bVar4 = std::operator==("subcommand failed",&local_78);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x52f,"\"subcommand failed\" == err");
    testing::Test::Check
              (g_current_test,
               (long)*(pointer *)
                      ((long)&(this->super_BuildWithLogTest).super_BuildTest.command_runner_.
                              commands_ran_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data + 8) -
               (long)(this->super_BuildWithLogTest).super_BuildTest.command_runner_.commands_ran_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start == 0x20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x530,"1u == command_runner_.commands_ran_.size()");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(this_02);
    State::Reset(state);
    Builder::Cleanup(this_01);
    Plan::Reset(local_38);
    piVar1 = &(this->super_BuildWithLogTest).super_BuildTest.fs_.now_;
    *piVar1 = *piVar1 + 1;
    pTVar3 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"out1",(allocator<char> *)&local_58);
    pNVar5 = Builder::AddTarget(this_01,&local_98,&local_78);
    testing::Test::Check
              (pTVar3,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x53a,"builder_.AddTarget(\"out1\", &err)");
    std::__cxx11::string::~string((string *)&local_98);
    pTVar3 = g_current_test;
    bVar4 = Builder::AlreadyUpToDate(this_01);
    testing::Test::Check
              (pTVar3,!bVar4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x53b,"builder_.AlreadyUpToDate()");
    pTVar3 = g_current_test;
    bVar4 = Builder::Build(this_01,&local_78);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x53c,"builder_.Build(&err)");
    testing::Test::Check
              (g_current_test,
               (long)*(pointer *)
                      ((long)&(this->super_BuildWithLogTest).super_BuildTest.command_runner_.
                              commands_ran_.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data + 8) -
               (long)(this->super_BuildWithLogTest).super_BuildTest.command_runner_.commands_ran_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start == 0x20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x53d,"1u == command_runner_.commands_ran_.size()");
    pTVar3 = g_current_test;
    bVar4 = std::operator==("",&local_78);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x53e,"\"\" == err");
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(BuildWithLogTest, RebuildAfterFailure) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule touch-fail-tick2\n"
"  command = touch-fail-tick2\n"
"build out1: touch-fail-tick2 in\n"));

  string err;

  fs_.Create("in", "");

  // Run once successfully to get out1 in the log
  EXPECT_TRUE(builder_.AddTarget("out1", &err));
  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);
  EXPECT_EQ(1u, command_runner_.commands_ran_.size());

  command_runner_.commands_ran_.clear();
  state_.Reset();
  builder_.Cleanup();
  builder_.plan_.Reset();

  fs_.Tick();
  fs_.Create("in", "");

  // Run again with a failure that updates the output file timestamp
  EXPECT_TRUE(builder_.AddTarget("out1", &err));
  EXPECT_FALSE(builder_.Build(&err));
  EXPECT_EQ("subcommand failed", err);
  EXPECT_EQ(1u, command_runner_.commands_ran_.size());

  command_runner_.commands_ran_.clear();
  state_.Reset();
  builder_.Cleanup();
  builder_.plan_.Reset();

  fs_.Tick();

  // Run again, should rerun even though the output file is up to date on disk
  EXPECT_TRUE(builder_.AddTarget("out1", &err));
  EXPECT_FALSE(builder_.AlreadyUpToDate());
  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ(1u, command_runner_.commands_ran_.size());
  EXPECT_EQ("", err);
}